

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> * __thiscall
testing::internal::ReturnRefAction::operator_cast_to_Action
          (Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
           *__return_storage_ptr__,ReturnRefAction *this)

{
  _func_int **pp_Var1;
  ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *impl;
  
  impl = (ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
         operator_new(0x10);
  pp_Var1 = *(_func_int ***)this;
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00343a98;
  impl[1]._vptr_ActionInterface = pp_Var1;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Action
            (__return_storage_ptr__,impl);
  return __return_storage_ptr__;
}

Assistant:

operator Action<F>() const {
    typedef typename Function<F>::Result Result;
    // Asserts that the function return type is a reference.  This
    // catches the user error of using ReturnRef(x) when Return(x)
    // should be used, and generates some helpful error message.
    GTEST_COMPILE_ASSERT_(std::is_reference<Result>::value,
                          use_Return_instead_of_ReturnRef_to_return_a_value);
    return Action<F>(new Impl<F>(ref_));
  }